

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBezierCurves(XMLLoader *this,Ref<embree::XML> *xml,CurveSubtype subtype)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  HairSetNode *pHVar4;
  FILE *pFVar5;
  Ref<embree::XML> *siglen;
  reference pvVar6;
  reference pvVar7;
  char *__nptr;
  int in_ECX;
  undefined8 in_RDX;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  string tessellation_rate;
  size_t i_7;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> indices;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::HairSetNode> mesh;
  RTCGeometryType type;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_5;
  size_t i_4;
  size_t i_6;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff878;
  XML *in_stack_fffffffffffff880;
  size_type in_stack_fffffffffffff888;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff8a0;
  XML *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b0;
  allocator *paVar8;
  XML *in_stack_fffffffffffff8b8;
  size_t in_stack_fffffffffffff910;
  Ref<embree::XML> *xml_00;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff918;
  XMLLoader *pXVar9;
  undefined8 in_stack_fffffffffffff920;
  RTCGeometryType type_00;
  HairSetNode *in_stack_fffffffffffff928;
  BBox1f in_stack_fffffffffffff930;
  size_t in_stack_fffffffffffff950;
  XML *in_stack_fffffffffffff958;
  HairSetNode *in_stack_fffffffffffff990;
  undefined7 in_stack_fffffffffffff998;
  byte in_stack_fffffffffffff99f;
  Ref<embree::XML> *in_stack_fffffffffffffa00;
  XMLLoader *in_stack_fffffffffffffa08;
  allocator local_549;
  string local_548 [32];
  long *local_528;
  EVP_PKEY_CTX local_520 [31];
  allocator local_501;
  string local_500 [32];
  string local_4e0 [16];
  Ref<embree::XML> *in_stack_fffffffffffffb30;
  XMLLoader *in_stack_fffffffffffffb38;
  value_type local_4c0;
  Ref<embree::XML> *local_4b8;
  allocator local_4a9;
  string local_4a8 [32];
  long *local_488;
  vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> local_480;
  allocator local_461;
  string local_460 [32];
  long *local_440;
  undefined1 local_438 [8];
  ulong local_430;
  undefined8 local_428;
  undefined8 local_420;
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  long *local_3c8;
  undefined1 local_3c0 [8];
  ulong local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  Ref<embree::XML> local_3a0;
  undefined1 local_398 [48];
  string local_368 [32];
  SharedState *local_348;
  undefined1 local_339;
  _Rb_tree_impl<std::less<unsigned_long>,_true> local_338;
  allocator local_301;
  string local_300 [32];
  long *local_2e0;
  Ref<embree::SceneGraph::Node> local_2d8;
  int local_2cc;
  undefined8 local_2c8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  SharedState **local_270;
  XMLLoader *local_268;
  undefined1 *local_258;
  undefined1 *local_248;
  long **local_238;
  Ref<embree::XML> *local_228;
  long **local_218;
  long **local_208;
  SharedState **local_1f8;
  long **local_1e8;
  long **local_1d8;
  _Rb_tree_impl<std::less<unsigned_long>,_true> *local_1c8;
  undefined1 *local_1c0;
  _Rb_tree_header *local_1b8;
  SharedState **local_1b0;
  SharedState **local_1a8;
  Ref<embree::SceneGraph::Node> *local_1a0;
  _Base_ptr *local_198;
  _Base_ptr *local_190;
  Ref<embree::SceneGraph::Node> *local_180;
  HairSetNode *local_170;
  _Base_ptr *local_168;
  _Base_ptr *local_160;
  _Base_ptr *local_158;
  _Base_ptr *local_150;
  _Base_ptr *local_148;
  _Base_ptr *local_140;
  _Base_ptr *local_138;
  _Base_ptr *local_130;
  _Base_ptr *local_128;
  _Base_ptr *local_120;
  HairSetNode *local_110;
  _Base_ptr *local_100;
  ulong local_e0;
  undefined1 *local_d8;
  ulong local_c0;
  undefined1 *local_b8;
  ulong local_a0;
  XMLLoader *local_98;
  XMLLoader *local_80;
  undefined1 *local_50;
  undefined1 *local_20;
  
  type_00 = (RTCGeometryType)((ulong)in_stack_fffffffffffff920 >> 0x20);
  local_2cc = in_ECX;
  local_2c8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"material",&local_301);
  XML::child((XML *)in_stack_fffffffffffff930,(string *)in_stack_fffffffffffff928);
  loadMaterial(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  local_238 = &local_2e0;
  if (local_2e0 != (long *)0x0) {
    (**(code **)(*local_2e0 + 0x18))();
  }
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  local_338.super__Rb_tree_header._M_header._M_right._0_4_ = 0x19 - (uint)(local_2cc == 0);
  pHVar4 = (HairSetNode *)::operator_new(0x118);
  local_339 = 1;
  local_198 = &local_338.super__Rb_tree_header._M_header._M_parent;
  local_1a0 = &local_2d8;
  local_338.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2d8.ptr;
  if (local_2d8.ptr != (Node *)0x0) {
    (*((local_2d8.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  local_338._4_4_ = 0;
  local_338._0_4_ = 0x3f800000;
  local_1b8 = &local_338.super__Rb_tree_header;
  local_1c0 = &local_338.field_0x4;
  local_1c8 = &local_338;
  local_338.super__Rb_tree_header._M_header._M_color = _S_red;
  local_338.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  SceneGraph::HairSetNode::HairSetNode
            (in_stack_fffffffffffff928,type_00,in_stack_fffffffffffff918,in_stack_fffffffffffff930,
             in_stack_fffffffffffff910);
  local_339 = 0;
  local_168 = &local_338.super__Rb_tree_header._M_header._M_left;
  local_170 = pHVar4;
  local_338.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar4;
  if (pHVar4 != (HairSetNode *)0x0) {
    (*(code *)(((XML *)(pHVar4->super_Node).super_RefCount._vptr_RefCount)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)();
  }
  local_190 = &local_338.super__Rb_tree_header._M_header._M_parent;
  if ((Node *)local_338.super__Rb_tree_header._M_header._M_parent != (Node *)0x0) {
    (*((RefCount *)&(local_338.super__Rb_tree_header._M_header._M_parent)->_M_color)->_vptr_RefCount
      [3])();
  }
  local_280 = local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"animated_positions",(allocator *)(local_398 + 0x2f));
  XML::childOpt(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)(local_398 + 0x2f));
  local_270 = &local_348;
  if (local_348 == (SharedState *)0x0) {
    local_130 = &local_338.super__Rb_tree_header._M_header._M_left;
    local_288 = local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"positions",&local_3e9);
    XML::childOpt(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    loadVec3ffArray(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
    local_258 = local_3c0;
    for (local_c0 = 0; local_c0 < local_3b8; local_c0 = local_c0 + 1) {
    }
    local_b8 = local_258;
    local_50 = local_258;
    alignedFree(in_stack_fffffffffffff868);
    local_3a8 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_218 = &local_3c8;
    if (local_3c8 != (long *)0x0) {
      (**(code **)(*local_3c8 + 0x18))();
    }
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    local_290 = local_2c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_410,"positions2",&local_411);
    in_stack_fffffffffffff99f = XML::hasChild(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
    if ((in_stack_fffffffffffff99f & 1) != 0) {
      local_138 = &local_338.super__Rb_tree_header._M_header._M_left;
      local_298 = local_2c8;
      in_stack_fffffffffffff990 = (HairSetNode *)local_338.super__Rb_tree_header._M_header._M_left;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_460,"positions2",&local_461);
      XML::childOpt(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
      loadVec3ffArray(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      local_248 = local_438;
      for (local_e0 = 0; local_e0 < local_430; local_e0 = local_e0 + 1) {
      }
      local_d8 = local_248;
      local_20 = local_248;
      alignedFree(in_stack_fffffffffffff868);
      local_420 = 0;
      local_428 = 0;
      local_430 = 0;
      local_208 = &local_440;
      if (local_440 != (long *)0x0) {
        (**(code **)(*local_440 + 0x18))();
      }
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
    }
  }
  else {
    local_398._32_8_ = (FILE *)0x0;
    while( true ) {
      uVar1 = local_398._32_8_;
      local_1a8 = &local_348;
      pFVar5 = (FILE *)XML::size((XML *)0x394079);
      if (pFVar5 <= (ulong)uVar1) break;
      local_128 = &local_338.super__Rb_tree_header._M_header._M_left;
      local_1b0 = &local_348;
      XML::child(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      loadVec3ffArray(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
      pXVar9 = (XMLLoader *)local_398;
      for (local_a0 = 0; local_a0 < (ulong)local_398._8_8_; local_a0 = local_a0 + 1) {
      }
      local_268 = pXVar9;
      local_98 = pXVar9;
      local_80 = pXVar9;
      alignedFree(in_stack_fffffffffffff868);
      in_stack_fffffffffffffa08 = pXVar9;
      *(undefined8 *)((long)&(pXVar9->path).filename.field_2 + 8) = 0;
      (pXVar9->path).filename.field_2._M_allocated_capacity = 0;
      (pXVar9->path).filename._M_string_length = 0;
      in_stack_fffffffffffffa00 = &local_3a0;
      local_228 = in_stack_fffffffffffffa00;
      if (local_3a0.ptr != (XML *)0x0) {
        (*((local_3a0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      local_398._32_8_ = local_398._32_8_ + 1;
    }
  }
  local_1f8 = &local_348;
  if (local_348 != (SharedState *)0x0) {
    (**(code **)(*(long *)&(local_348->materialMap)._M_t._M_impl + 0x18))();
  }
  local_2a0 = local_2c8;
  paVar8 = &local_4a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"indices",paVar8);
  XML::childOpt(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  loadVec2iArray((XMLLoader *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
                 (Ref<embree::XML> *)in_stack_fffffffffffff990);
  local_1e8 = &local_488;
  if (local_488 != (long *)0x0) {
    (**(code **)(*local_488 + 0x18))();
  }
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  local_140 = &local_338.super__Rb_tree_header._M_header._M_left;
  pXVar9 = (XMLLoader *)((long)local_338.super__Rb_tree_header._M_header._M_left + 0xd8);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::size(&local_480);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::resize(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_4b8 = (Ref<embree::XML> *)0x0;
  while (xml_00 = local_4b8,
        siglen = (Ref<embree::XML> *)
                 std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::size
                           (&local_480), xml_00 < siglen) {
    pvVar6 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::operator[]
                       (&local_480,(size_type)local_4b8);
    uVar3 = (pvVar6->field_0).field_0.x;
    pvVar6 = std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::operator[]
                       (&local_480,(size_type)local_4b8);
    SceneGraph::HairSetNode::Hair::Hair(&local_4c0,uVar3,(pvVar6->field_0).field_0.y);
    local_148 = &local_338.super__Rb_tree_header._M_header._M_left;
    pvVar7 = std::
             vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
             ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           *)((long)local_338.super__Rb_tree_header._M_header._M_left + 0xd8),
                          (size_type)local_4b8);
    *pvVar7 = local_4c0;
    local_4b8 = (Ref<embree::XML> *)((long)&local_4b8->ptr + 1);
  }
  local_2a8 = local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"tessellation_rate",&local_501);
  XML::parm(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  bVar2 = std::operator!=(in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
  if (bVar2) {
    __nptr = (char *)std::__cxx11::string::c_str();
    uVar3 = atoi(__nptr);
    local_150 = &local_338.super__Rb_tree_header._M_header._M_left;
    siglen = (Ref<embree::XML> *)(ulong)uVar3;
    *(uint *)((long)local_338.super__Rb_tree_header._M_header._M_left + 0x110) = uVar3;
  }
  local_2b0 = local_2c8;
  paVar8 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"flags",paVar8);
  XML::childOpt(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  loadUCharArray(pXVar9,xml_00);
  local_158 = &local_338.super__Rb_tree_header._M_header._M_left;
  ctx = local_520;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff880,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff878);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff880);
  local_1d8 = &local_528;
  if (local_528 != (long *)0x0) {
    (**(code **)(*local_528 + 0x18))();
  }
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  local_160 = &local_338.super__Rb_tree_header._M_header._M_left;
  SceneGraph::HairSetNode::verify
            ((HairSetNode *)local_338.super__Rb_tree_header._M_header._M_left,ctx,sig,(size_t)siglen
             ,in_R8,in_R9);
  local_120 = &local_338.super__Rb_tree_header._M_header._M_left;
  local_110 = (HairSetNode *)local_338.super__Rb_tree_header._M_header._M_left;
  (in_RDI->super_RefCount)._vptr_RefCount =
       (_func_int **)local_338.super__Rb_tree_header._M_header._M_left;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string(local_4e0);
  std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::~vector
            ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
             in_stack_fffffffffffff880);
  local_100 = &local_338.super__Rb_tree_header._M_header._M_left;
  if ((HairSetNode *)local_338.super__Rb_tree_header._M_header._M_left != (HairSetNode *)0x0) {
    (*(((Node *)&(local_338.super__Rb_tree_header._M_header._M_left)->_M_color)->super_RefCount).
      _vptr_RefCount[3])();
  }
  local_180 = &local_2d8;
  if (local_2d8.ptr != (Node *)0x0) {
    (*((local_2d8.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBezierCurves(const Ref<XML>& xml, SceneGraph::CurveSubtype subtype)
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    RTCGeometryType type = (subtype == SceneGraph::ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3ffArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions")));
      if (xml->hasChild("positions2")) 
        mesh->positions.push_back(loadVec3ffArray(xml->childOpt("positions2")));
    }
    
    std::vector<Vec2i> indices = loadVec2iArray(xml->childOpt("indices"));
    mesh->hairs.resize(indices.size()); 
    for (size_t i=0; i<indices.size(); i++) 
      mesh->hairs[i] = SceneGraph::HairSetNode::Hair(indices[i].x,indices[i].y);

    std::string tessellation_rate = xml->parm("tessellation_rate");
    if (tessellation_rate != "")
      mesh->tessellation_rate = atoi(tessellation_rate.c_str());

    mesh->flags = loadUCharArray(xml->childOpt("flags"));

    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }